

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<48U,_unsigned_short,_void,_false>::operator+=
          (uintwide_t<48U,_unsigned_short,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other)

{
  uintwide_t<24U,_unsigned_char,_void,_false> self;
  
  if (this == (uintwide_t<48U,_unsigned_short,_void,_false> *)other) {
    _self = *(undefined4 *)other;
    other = &self;
  }
  uintwide_t<48u,unsigned_short,void,false>::
  eval_add_n<unsigned_short*,unsigned_short_const*,unsigned_short_const*>
            ((unsigned_short *)this,(unsigned_short *)this,(unsigned_short *)other,3,0);
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto operator+=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t self(other); // NOLINT(performance-unnecessary-copy-initialization)

        // Unary addition function.
        const auto carry = eval_add_n(values.begin(), // LCOV_EXCL_LINE
                                      values.cbegin(),
                                      self.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }
      else
      {
        // Unary addition function.
        const auto carry = eval_add_n(values.begin(),
                                      values.cbegin(),
                                      other.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }

      return *this;
    }